

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::ImageTransition::submit(ImageTransition *this,SubmitContext *context)

{
  Context *this_00;
  DeviceInterface *pDVar1;
  undefined4 local_70 [2];
  VkImageMemoryBarrier barrier;
  VkCommandBuffer cmd;
  DeviceInterface *vkd;
  SubmitContext *context_local;
  ImageTransition *this_local;
  
  this_00 = SubmitContext::getContext(context);
  pDVar1 = Context::getDeviceInterface(this_00);
  barrier._64_8_ = SubmitContext::getCommandBuffer(context);
  local_70[0] = 0x2d;
  barrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  barrier._4_4_ = 0;
  barrier.pNext._0_4_ = this->m_srcAccesses;
  barrier.pNext._4_4_ = this->m_dstAccesses;
  barrier.srcAccessMask = this->m_srcLayout;
  barrier.dstAccessMask = this->m_dstLayout;
  barrier.oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  barrier.newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  barrier._32_8_ = SubmitContext::getImage(context);
  barrier.image.m_internal._0_4_ = 1;
  barrier.image.m_internal._4_4_ = 0;
  barrier.subresourceRange.aspectMask = 1;
  barrier.subresourceRange.baseMipLevel = 0;
  barrier.subresourceRange.levelCount = 1;
  (*pDVar1->_vptr_DeviceInterface[0x6d])
            (pDVar1,barrier._64_8_,(ulong)this->m_srcStages,(ulong)this->m_dstStages,0,0,0,0,0,1,
             local_70);
  return;
}

Assistant:

void ImageTransition::submit (SubmitContext& context)
{
	const vk::DeviceInterface&		vkd			= context.getContext().getDeviceInterface();
	const vk::VkCommandBuffer		cmd			= context.getCommandBuffer();
	const vk::VkImageMemoryBarrier	barrier		=
	{
		vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,
		DE_NULL,

		m_srcAccesses,
		m_dstAccesses,

		m_srcLayout,
		m_dstLayout,

		VK_QUEUE_FAMILY_IGNORED,
		VK_QUEUE_FAMILY_IGNORED,

		context.getImage(),
		{
			vk::VK_IMAGE_ASPECT_COLOR_BIT,
			0u, 1u,
			0u, 1u
		}
	};

	vkd.cmdPipelineBarrier(cmd, m_srcStages, m_dstStages, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 0, (const vk::VkBufferMemoryBarrier*)DE_NULL, 1, &barrier);
}